

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  pointer puVar3;
  size_type sVar4;
  ostream *poVar5;
  socklen_t sVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end_00;
  long *plVar7;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *__range1;
  int __fd;
  unsigned_long *puVar8;
  iterator puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *j;
  undefined8 *puVar10;
  pointer puVar11;
  long lVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *i;
  _Alloc_hider _Var13;
  pointer pvVar14;
  byte bVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<unsigned_long> __l_00;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  scc_1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  scc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nodes;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  graph;
  undefined1 local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1b0 [32];
  undefined1 *local_190;
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  bVar15 = 0;
  end_00._M_current = (unsigned_long *)local_208;
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"A","");
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"B","");
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"C","");
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"D","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"E","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"F","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"G","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"H","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"I","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"J","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"K","");
  plVar7 = local_40;
  local_50[0] = plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"L","");
  end._M_current = &local_1e8;
  __l._M_len = 0xc;
  __l._M_array = (iterator)local_1b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c8,__l,(allocator_type *)end._M_current);
  lVar12 = -0x180;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  ::scc::AssocMapType<std::__cxx11::string,Graph<std::__cxx11::string,scc::AssocMapType>::Node>::
  construct<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((Container *)local_1b0,
             (AssocMapType<std::__cxx11::string,Graph<std::__cxx11::string,scc::AssocMapType>::Node>
              *)local_1c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_1c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,end);
  sVar6 = (socklen_t)end._M_current;
  paVar1 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"A","");
  pvVar14 = (pointer)(local_208 + 0x10);
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"B","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"B","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"D","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"B","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"E","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"B","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"C","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"C","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"F","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"E","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"B","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"E","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"F","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"E","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"G","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"F","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"C","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"F","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"H","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"G","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"H","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"G","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"J","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"H","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"K","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"I","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"G","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"J","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"I","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"K","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"L","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"L","");
  local_208._0_8_ = pvVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"J","");
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_1b0,(int)&local_1e8,(sockaddr *)local_208,sVar6);
  if ((pointer)local_208._0_8_ != pvVar14) {
    operator_delete((void *)local_208._0_8_,
                    (ulong)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_208._16_8_)->_M_impl).super__Vector_impl_data._M_start + 1
                           ));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::scc((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         *)&local_1e8,
        (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
         *)local_1b0);
  sVar4 = local_1e8._M_string_length;
  for (_Var13._M_p = local_1e8._M_dataplus._M_p; _Var13._M_p != (pointer)sVar4;
      _Var13._M_p = _Var13._M_p + 0x18) {
    puVar2 = *(undefined8 **)(_Var13._M_p + 8);
    for (puVar10 = *(undefined8 **)_Var13._M_p; puVar10 != puVar2; puVar10 = puVar10 + 4) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)*puVar10,puVar10[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)&local_1e8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  puVar8 = &DAT_00107140;
  puVar9 = (iterator)local_1b0;
  for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar9 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar15 * -2 + 1;
    puVar9 = puVar9 + (ulong)bVar15 * -2 + 1;
  }
  __l_00._M_len = 0xd;
  __l_00._M_array = (iterator)local_1b0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1e8,__l_00,
             (allocator_type *)local_208);
  ::scc::VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node>::
  construct<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Container *)local_1b0,
             (VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node> *)
             local_1e8._M_dataplus._M_p,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_1e8._M_string_length,end_00);
  local_208._0_8_ = (pointer)0x1;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  sVar6 = (socklen_t)end_00._M_current;
  __fd = (int)local_208;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x2;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x2;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x2;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x3;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x5;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x5;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x5;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x6;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x6;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x7;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x7;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xa;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x8;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0x9;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0xa;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x9;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = (pointer)0xb;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_0000000c;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  local_208._0_8_ = &DAT_0000000c;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xa;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_1b0,__fd,(sockaddr *)&local_1c8,sVar6);
  Graph<unsigned_long,_scc::VectorType>::scc
            ((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)local_208,(Graph<unsigned_long,_scc::VectorType> *)local_1b0);
  for (pvVar14 = (pointer)local_208._0_8_; pvVar14 != (pointer)local_208._8_8_;
      pvVar14 = pvVar14 + 1) {
    puVar3 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar11 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start; puVar11 != puVar3;
        puVar11 = puVar11 + 1) {
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_208);
  std::
  vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
  ::~vector((vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
             *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    local_1e8.field_2._M_allocated_capacity - (long)local_1e8._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main() {
    using namespace scc;
    {
        std::vector<std::string> nodes{
                "A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L"
        };
        Graph<std::string, AssocMapType> graph{nodes.begin(), nodes.end()};
        graph.connect("A", "B");
        graph.connect("B", "D");
        graph.connect("B", "E");
        graph.connect("B", "C");
        graph.connect("C", "F");
        graph.connect("E", "B");
        graph.connect("E", "F");
        graph.connect("E", "G");
        graph.connect("F", "C");
        graph.connect("F", "H");
        graph.connect("G", "H");
        graph.connect("G", "J");
        graph.connect("H", "K");
        graph.connect("I", "G");
        graph.connect("J", "I");
        graph.connect("K", "L");
        graph.connect("L", "J");
        auto scc = graph.scc();
        for (auto &i: scc) {
            for (auto &j: i) {
                std::cout << j << " ";
            }
            std::cout << std::endl;
        }
    }

    {
        std::vector<size_t> nodes{
               0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12
        };
        Graph<size_t , VectorType> graph{nodes.begin(), nodes.end()};
        graph.connect(1, 2);
        graph.connect(2, 4);
        graph.connect(2, 5);
        graph.connect(2, 3);
        graph.connect(3, 6);
        graph.connect(5, 2);
        graph.connect(5, 6);
        graph.connect(5, 7);
        graph.connect(6, 3);
        graph.connect(6, 8);
        graph.connect(7, 8);
        graph.connect(7, 10);
        graph.connect(8, 11);
        graph.connect(9, 7);
        graph.connect(10, 9);
        graph.connect(11, 12);
        graph.connect(12, 10);
        auto scc = graph.scc();
        for (auto &i: scc) {
            for (auto &j: i) {
                std::cout << j << " ";
            }
            std::cout << std::endl;
        }
    }
    return 0;
}